

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O3

void embree::InstanceArrayRandomTest<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>_>::
     intersectFilter(RTCFilterFunctionNArguments *args)

{
  uint *puVar1;
  RTCRayQueryContext *pRVar2;
  uint uVar3;
  runtime_error *this;
  ulong uVar4;
  
  uVar3 = args->N;
  if (uVar3 != 0) {
    pRVar2 = args->context;
    uVar4 = 0;
    do {
      if ((args->valid[uVar4] != 0) &&
         (0xf < *(uint *)(args->ray + (ulong)((int)uVar4 + uVar3 * 10) * 4))) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Invalid ray id in intersection filter.");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (args->valid[uVar4] != 0) {
        puVar1 = pRVar2[1].instID + *(uint *)(args->ray + (ulong)((int)uVar4 + uVar3 * 10) * 4);
        *puVar1 = *puVar1 + 1;
        uVar3 = args->N;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

static void intersectFilter(const RTCFilterFunctionNArguments* args)
    {
      assert(args);
      assert(args->context);

      RayQueryContext* context = (RayQueryContext*)(args->context);

      for (unsigned int i=0; i<args->N; i++) 
      {
        const unsigned int rayId = RTCRayN_id(args->ray, args->N, i);
        if(args->valid[i] && rayId >= 16)
          throw std::runtime_error("Invalid ray id in intersection filter.");
        if (args->valid[i])
        {
          assert(rayId < 16);
          context->numHits[rayId] += 1;
        }
      }
    }